

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_saveDictHC(LZ4_streamHC_t *LZ4_streamHCPtr,char *safeBuffer,int dictSize)

{
  int iVar1;
  uint uVar2;
  U32 endIndex;
  int prefixSize;
  LZ4HC_CCtx_internal *streamPtr;
  int dictSize_local;
  char *safeBuffer_local;
  LZ4_streamHC_t *LZ4_streamHCPtr_local;
  
  iVar1 = (int)LZ4_streamHCPtr->table[0x8000] -
          ((int)LZ4_streamHCPtr->table[0x8001] + (LZ4_streamHCPtr->internal_donotuse).dictLimit);
  streamPtr._4_4_ = dictSize;
  if (0x10000 < dictSize) {
    streamPtr._4_4_ = 0x10000;
  }
  if (streamPtr._4_4_ < 4) {
    streamPtr._4_4_ = 0;
  }
  if (iVar1 < streamPtr._4_4_) {
    streamPtr._4_4_ = iVar1;
  }
  if (0 < streamPtr._4_4_) {
    memmove(safeBuffer,(LZ4_streamHCPtr->internal_donotuse).end + -(long)streamPtr._4_4_,
            (long)streamPtr._4_4_);
  }
  uVar2 = (int)LZ4_streamHCPtr->table[0x8000] - (int)LZ4_streamHCPtr->table[0x8001];
  LZ4_streamHCPtr->table[0x8000] = safeBuffer + streamPtr._4_4_;
  LZ4_streamHCPtr->table[0x8001] = (LZ4_streamHCPtr->internal_donotuse).end + -(ulong)uVar2;
  (LZ4_streamHCPtr->internal_donotuse).dictLimit = uVar2 - streamPtr._4_4_;
  (LZ4_streamHCPtr->internal_donotuse).lowLimit = uVar2 - streamPtr._4_4_;
  if ((LZ4_streamHCPtr->internal_donotuse).nextToUpdate <
      (LZ4_streamHCPtr->internal_donotuse).dictLimit) {
    (LZ4_streamHCPtr->internal_donotuse).nextToUpdate =
         (LZ4_streamHCPtr->internal_donotuse).dictLimit;
  }
  return streamPtr._4_4_;
}

Assistant:

int LZ4_saveDictHC (LZ4_streamHC_t* LZ4_streamHCPtr, char* safeBuffer, int dictSize)
{
    LZ4HC_CCtx_internal* const streamPtr = &LZ4_streamHCPtr->internal_donotuse;
    int const prefixSize = (int)(streamPtr->end - (streamPtr->base + streamPtr->dictLimit));
    DEBUGLOG(5, "LZ4_saveDictHC(%p, %p, %d)", LZ4_streamHCPtr, safeBuffer, dictSize);
    assert(prefixSize >= 0);
    if (dictSize > 64 KB) dictSize = 64 KB;
    if (dictSize < 4) dictSize = 0;
    if (dictSize > prefixSize) dictSize = prefixSize;
    if (safeBuffer == NULL) assert(dictSize == 0);
    if (dictSize > 0)
        memmove(safeBuffer, streamPtr->end - dictSize, dictSize);
    {   U32 const endIndex = (U32)(streamPtr->end - streamPtr->base);
        streamPtr->end = (const BYTE*)safeBuffer + dictSize;
        streamPtr->base = streamPtr->end - endIndex;
        streamPtr->dictLimit = endIndex - (U32)dictSize;
        streamPtr->lowLimit = endIndex - (U32)dictSize;
        if (streamPtr->nextToUpdate < streamPtr->dictLimit)
            streamPtr->nextToUpdate = streamPtr->dictLimit;
    }
    return dictSize;
}